

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_reference.c
# Opt level: O1

bool_t prf_external_reference_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint8_t uVar1;
  uint16_t uVar2;
  int16_t iVar3;
  int32_t iVar4;
  uint8_t *puVar5;
  uint n_bytes;
  
  uVar2 = bf_get_uint16_be(bfile);
  node->opcode = uVar2;
  if (uVar2 == prf_external_reference_info.opcode) {
    uVar2 = bf_get_uint16_be(bfile);
    node->length = uVar2;
    if (uVar2 < 0xd4) {
      prf_error(9,"external reference node too short (%d bytes)");
    }
    else {
      if (node->data != (uint8_t *)0x0) {
LAB_00105514:
        puVar5 = node->data;
        bf_read(bfile,puVar5,200);
        uVar1 = bf_get_int8(bfile);
        puVar5[200] = uVar1;
        uVar1 = bf_get_int8(bfile);
        puVar5[0xc9] = uVar1;
        iVar3 = bf_get_int16_be(bfile);
        *(int16_t *)(puVar5 + 0xca) = iVar3;
        iVar3 = bf_get_int16_be(bfile);
        *(int16_t *)(puVar5 + 0xcc) = iVar3;
        iVar4 = bf_get_int32_be(bfile);
        *(int32_t *)(puVar5 + 0xd0) = iVar4;
        if (node->length < 0xd7) {
          return 1;
        }
        bf_read(bfile,node->data + 0xd6,node->length - 0xd6);
        return 1;
      }
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        puVar5 = (uint8_t *)malloc((ulong)uVar2);
      }
      else {
        puVar5 = (uint8_t *)pool_malloc(pool_id,(uint)uVar2);
      }
      node->data = puVar5;
      if (puVar5 != (uint8_t *)0x0) goto LAB_00105514;
      prf_error(9,"memory allocation problem (returned NULL)");
    }
    n_bytes = 4;
  }
  else {
    prf_error(9,"tried external reference node load method on node of type %d.",(ulong)uVar2);
    n_bytes = 2;
  }
  bf_rewind(bfile,n_bytes);
  return 0;
}

Assistant:

static
bool_t
prf_external_reference_load_f(prf_node_t * node,
                              prf_state_t * state,
                              bfile_t * bfile)
{
  int pos;

  assert(node != NULL && state != NULL && bfile != NULL);
  
  node->opcode = bf_get_uint16_be(bfile);
  if (node->opcode != prf_external_reference_info.opcode) {
    prf_error(9,
              "tried external reference node load method on node of type %d.",
              node->opcode);
    bf_rewind(bfile, 2);
    return FALSE;
  }

  node->length = bf_get_uint16_be(bfile);
  if (node->length < NODE_DATA_SIZE + 4) {
    prf_error(9, "external reference node too short (%d bytes)", node->length);
    bf_rewind(bfile, 4);
    return FALSE;
  }

  if (node->length > 4 && node->data == NULL) {
    assert(state->model != NULL);
    if (state->model->mempool_id == 0) {
      node->data = (uint8_t *)malloc(node->length - 4 + NODE_DATA_PAD);
    }
    else {
      node->data = (uint8_t *)pool_malloc(state->model->mempool_id,
                                          node->length - 4 + NODE_DATA_PAD);
    }
    if (node->data == NULL) {
      prf_error(9, "memory allocation problem (returned NULL)");
      bf_rewind(bfile, 4);
      return FALSE;
    }
  }

  pos = 4;
  do {
    node_data * data;
    data = (node_data *) node->data;
    bf_read(bfile, data->filename, 200); pos += 200;
    data->reserved1 = bf_get_int8(bfile); pos += 1;
    data->reserved2 = bf_get_int8(bfile); pos += 1;
    data->reserved3[0] = bf_get_int16_be(bfile); pos += 2;
    data->reserved3[1] = bf_get_int16_be(bfile); pos += 2;
    data->flags = bf_get_int32_be(bfile); pos += 4;
  } while (FALSE);

  if (node->length > pos)
    pos += bf_read(bfile, node->data + pos - 4 + NODE_DATA_PAD,
                   node->length - pos);

  return TRUE;
}